

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O3

mat<4UL,_4UL> * __thiscall
mat<4UL,_4UL>::adjugate(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *this)

{
  double dVar1;
  long lVar2;
  int iVar3;
  double *pdVar4;
  size_t row;
  bool bVar5;
  uint uVar6;
  mat<3UL,_3UL> local_78;
  
  __return_storage_ptr__->rows[3].data[2] = 0.0;
  __return_storage_ptr__->rows[3].data[3] = 0.0;
  __return_storage_ptr__->rows[3].data[0] = 0.0;
  __return_storage_ptr__->rows[3].data[1] = 0.0;
  __return_storage_ptr__->rows[2].data[2] = 0.0;
  __return_storage_ptr__->rows[2].data[3] = 0.0;
  __return_storage_ptr__->rows[2].data[0] = 0.0;
  __return_storage_ptr__->rows[2].data[1] = 0.0;
  __return_storage_ptr__->rows[1].data[2] = 0.0;
  __return_storage_ptr__->rows[1].data[3] = 0.0;
  __return_storage_ptr__->rows[1].data[0] = 0.0;
  __return_storage_ptr__->rows[1].data[1] = 0.0;
  __return_storage_ptr__->rows[0].data[2] = 0.0;
  __return_storage_ptr__->rows[0].data[3] = 0.0;
  __return_storage_ptr__->rows[0].data[0] = 0.0;
  __return_storage_ptr__->rows[0].data[1] = 0.0;
  pdVar4 = __return_storage_ptr__->rows[3].data + 3;
  row = 3;
  iVar3 = 0;
  do {
    lVar2 = 0;
    do {
      get_minor(&local_78,this,row,lVar2 + 3);
      dVar1 = dt<3UL>::det(&local_78);
      uVar6 = (uint)((ulong)dVar1 >> 0x20);
      if (((int)lVar2 + iVar3 & 1U) != 0) {
        uVar6 = uVar6 ^ 0x80000000;
      }
      pdVar4[lVar2] = (double)CONCAT44(uVar6,SUB84(dVar1,0));
      lVar2 = lVar2 + -1;
    } while (lVar2 != -4);
    pdVar4 = pdVar4 + -4;
    iVar3 = iVar3 + -1;
    bVar5 = row != 0;
    row = row - 1;
  } while (bVar5);
  return __return_storage_ptr__;
}

Assistant:

mat<nrows, ncols> adjugate() const
    {
        mat<nrows, ncols> ret;
        for (size_t i = nrows; i--;)
            for (size_t j = ncols; j--; ret[i][j] = cofactor(i, j))
                ;
        return ret;
    }